

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

string * __thiscall
deqp::gles3::Functional::(anonymous_namespace)::genColorString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Vec4 *p)

{
  ulong uVar1;
  long lVar2;
  float fVar3;
  long lVar4;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  string *extraout_RAX_02;
  ulong uVar5;
  string *extraout_RAX_03;
  Vec4 blue;
  Vec4 yellow;
  Vec4 red;
  float afStack_14 [5];
  
  afStack_14[1] = 1.0;
  afStack_14[2] = 1.0;
  red.m_data[0] = 1.0;
  red.m_data[1] = 0.0;
  red.m_data[2] = 0.0;
  red.m_data[3] = 1.0;
  yellow.m_data[0] = 1.0;
  yellow.m_data[1] = 1.0;
  yellow.m_data[2] = 0.0;
  yellow.m_data[3] = 1.0;
  blue.m_data[0] = 0.0;
  blue.m_data[1] = 0.0;
  blue.m_data[2] = 1.0;
  blue.m_data[3] = 1.0;
  fVar3 = *(float *)this;
  if ((fVar3 == 1.0) && (!NAN(fVar3))) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 2) goto LAB_01250472;
      lVar2 = uVar5 * 4;
      uVar1 = uVar5 + 1;
      lVar4 = uVar5 + 1;
    } while ((*(float *)(this + lVar2 + 8) == afStack_14[lVar4]) &&
            (uVar5 = uVar1, !NAN(*(float *)(this + lVar2 + 8)) && !NAN(afStack_14[lVar4])));
    if (2 < uVar1) {
LAB_01250472:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(white)","")
      ;
      return extraout_RAX_00;
    }
    if ((fVar3 == 1.0) && (!NAN(fVar3))) {
      uVar5 = 0xffffffffffffffff;
      do {
        if (uVar5 == 2) goto LAB_0125050f;
        lVar2 = uVar5 * 4;
        uVar1 = uVar5 + 1;
        lVar4 = uVar5 + 2;
      } while ((*(float *)(this + lVar2 + 8) == red.m_data[lVar4]) &&
              (uVar5 = uVar1, !NAN(*(float *)(this + lVar2 + 8)) && !NAN(red.m_data[lVar4])));
      if (2 < uVar1) {
LAB_0125050f:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(red)","")
        ;
        return extraout_RAX_02;
      }
      if ((fVar3 == 1.0) && (!NAN(fVar3))) {
        uVar5 = 0xffffffffffffffff;
        do {
          if (uVar5 == 2) goto LAB_01250569;
          lVar2 = uVar5 * 4;
          uVar1 = uVar5 + 1;
          lVar4 = uVar5 + 2;
        } while ((*(float *)(this + lVar2 + 8) == yellow.m_data[lVar4]) &&
                (uVar5 = uVar1, !NAN(*(float *)(this + lVar2 + 8)) && !NAN(yellow.m_data[lVar4])));
        if (2 < uVar1) {
LAB_01250569:
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)__return_storage_ptr__,"(yellow)","");
          return extraout_RAX_03;
        }
      }
    }
  }
  if ((fVar3 == 0.0) && (!NAN(fVar3))) {
    uVar5 = 0xffffffffffffffff;
    do {
      if (uVar5 == 2) goto LAB_012504b9;
      lVar2 = uVar5 * 4;
      uVar1 = uVar5 + 1;
      lVar4 = uVar5 + 2;
    } while ((*(float *)(this + lVar2 + 8) == blue.m_data[lVar4]) &&
            (uVar5 = uVar1, !NAN(*(float *)(this + lVar2 + 8)) && !NAN(blue.m_data[lVar4])));
    if (2 < uVar1) {
LAB_012504b9:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"(blue)","");
      return extraout_RAX_01;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x1af8059);
  return extraout_RAX;
}

Assistant:

inline Vector<T, Size>::Vector (T x_, T y_, T z_, T w_)
{
	DE_STATIC_ASSERT(Size == 4);
	m_data[0] = x_;
	m_data[1] = y_;
	m_data[2] = z_;
	m_data[3] = w_;
}